

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SwapElements
          (ExtensionSet *this,int number,int index1,int index2)

{
  Rep *pRVar1;
  void *pvVar2;
  Extension *pEVar3;
  LogMessage *pLVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  pEVar3 = FindOrNull(this,number);
  if (pEVar3 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
               ,0x34e);
    pLVar4 = LogMessage::operator<<(&local_58,"CHECK failed: extension != NULL: ");
    pLVar4 = LogMessage::operator<<(pLVar4,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_59,pLVar4);
    LogMessage::~LogMessage(&local_58);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar3->type * 4)) {
  case 1:
  case 8:
    RepeatedField<int>::SwapElements((pEVar3->field_0).repeated_int32_value,index1,index2);
    break;
  case 2:
    RepeatedField<long>::SwapElements((pEVar3->field_0).repeated_int64_value,index1,index2);
    break;
  case 3:
    RepeatedField<unsigned_int>::SwapElements((pEVar3->field_0).repeated_uint32_value,index1,index2)
    ;
    break;
  case 4:
    RepeatedField<unsigned_long>::SwapElements
              ((pEVar3->field_0).repeated_uint64_value,index1,index2);
    break;
  case 5:
    RepeatedField<double>::SwapElements((pEVar3->field_0).repeated_double_value,index1,index2);
    break;
  case 6:
    RepeatedField<float>::SwapElements((pEVar3->field_0).repeated_float_value,index1,index2);
    break;
  case 7:
    RepeatedField<bool>::SwapElements((pEVar3->field_0).repeated_bool_value,index1,index2);
    break;
  case 9:
  case 10:
    pRVar1 = (((pEVar3->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).rep_;
    pvVar2 = pRVar1->elements[index1];
    pRVar1->elements[index1] = pRVar1->elements[index2];
    pRVar1->elements[index2] = pvVar2;
  }
  return;
}

Assistant:

void ExtensionSet::SwapElements(int number, int index1, int index2) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK(extension->is_repeated);

  switch (cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->SwapElements(index1, index2);
      break;
  }
}